

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::createPixmap(MakeCurrentPerfCase *this)

{
  NativePixmapFactory *pNVar1;
  NativePixmap *local_20;
  EGLSurface local_18;
  
  EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar1 = eglu::selectNativePixmapFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_20 = (NativePixmap *)
             (**(code **)(*(long *)pNVar1 + 0x20))
                       (pNVar1,(((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                               .m_data.ptr,this->m_display,this->m_config,0,0x100,0x100);
  local_18 = eglu::createPixmapSurface
                       ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                        super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                        .m_data.ptr,local_20,this->m_display,this->m_config,(EGLAttrib *)0x0);
  std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::push_back
            (&this->m_pixmaps,&local_20);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_surfaces,&local_18);
  return;
}

Assistant:

void MakeCurrentPerfCase::createPixmap (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const EGLint						width			= 256;
	const EGLint						height			= 256;

	const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	eglu::NativePixmap*					pixmap			= DE_NULL;
	EGLSurface							surface			= EGL_NO_SURFACE;

	try
	{
		pixmap	= pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, width, height);
		surface	= eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, m_display, m_config, DE_NULL);
	}
	catch (...)
	{
		if (surface != EGL_NO_SURFACE)
			egl.destroySurface(m_display, surface);

		delete pixmap;
		throw;
	}

	m_pixmaps.push_back(pixmap);
	m_surfaces.push_back(surface);
}